

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject_notification(Group *this,View *view,bool lock)

{
  _Object *p_Var1;
  uint uVar2;
  int iVar3;
  mapped_type *this_00;
  undefined4 extraout_var;
  uint64_t ijt;
  undefined3 in_register_00000011;
  uint64_t i;
  ulong uVar5;
  float fVar6;
  float fVar7;
  Code *local_38;
  long *plVar4;
  
  if (CONCAT31(in_register_00000011,lock) != 0) {
    std::mutex::lock(&this->mutex);
  }
  local_38 = (Code *)View::get_oid(view);
  this_00 = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->notification_views,(key_type *)&local_38);
  core::P<r_exec::View>::operator=(this_00,view);
  uVar5 = 0;
  while( true ) {
    uVar2 = (*((view->super_View).object.object)->_vptr__Object[10])();
    if ((uVar2 & 0xffff) <= uVar5) break;
    p_Var1 = (view->super_View).object.object;
    iVar3 = (*p_Var1->_vptr__Object[9])(p_Var1,uVar5 & 0xffff);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    (**(code **)(*plVar4 + 0x98))(plVar4);
    local_38 = (Code *)(view->super_View).object.object;
    r_code::list<r_code::Code_*>::push_back((list<r_code::Code_*> *)(plVar4 + 3),&local_38);
    (**(code **)(*plVar4 + 0xa0))(plVar4);
    uVar5 = uVar5 + 1;
  }
  ijt = (*Now)();
  r_code::View::set_ijt(&view->super_View,ijt);
  fVar6 = get_c_sln(this);
  fVar7 = get_c_sln_thr(this);
  if (fVar7 < fVar6) {
    fVar6 = View::get_sln(view);
    fVar7 = get_sln_thr(this);
    if (fVar7 < fVar6) {
      inject_reduction_jobs(this,view);
    }
  }
  if (lock) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  }
  return;
}

Assistant:

void Group::inject_notification(View *view, bool lock)
{
    if (lock) {
        mutex.lock();
    }

    notification_views[view->get_oid()] = view;

    for (uint64_t i = 0; i < view->object->references_size(); ++i) {
        Code *ref = view->object->get_reference(i);
        ref->acq_markers();
        ref->markers.push_back(view->object);
        ref->rel_markers();
    }

    view->set_ijt(Now());

    if (get_c_sln() > get_c_sln_thr() && view->get_sln() > get_sln_thr()) { // group is c-salient and view is salient.
        inject_reduction_jobs(view);
    }

    if (lock) {
        mutex.unlock();
    }
}